

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O0

void __thiscall amrex::AmrLevel::constructAreaNotToTag(AmrLevel *this)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  _func_int **pp_Var4;
  bool bVar5;
  int iVar6;
  Geometry *pGVar7;
  AmrLevel *this_00;
  Box *pBVar8;
  Box *in_RDI;
  BoxArray tagba_1;
  Box tagarea_1;
  BoxArray bxa;
  BoxArray tagba;
  Box tagarea;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *initialba;
  IntVect shft;
  BoxArray *in_stack_fffffffffffffbd8;
  int lev;
  BoxArray *rhs;
  BoxArray *pBVar9;
  Amr *in_stack_fffffffffffffbe0;
  AmrMesh *this_01;
  int in_stack_fffffffffffffbec;
  AmrMesh *in_stack_fffffffffffffbf0;
  Box *in_stack_fffffffffffffc00;
  Box *in_stack_fffffffffffffc20;
  BoxArray *in_stack_fffffffffffffc28;
  pointer local_374;
  int local_36c;
  int local_368 [3];
  undefined8 local_354;
  int local_34c;
  BoxArray local_348;
  BoxArray *in_stack_fffffffffffffd58;
  Real local_238;
  int local_230;
  undefined1 local_22c [80];
  int local_1dc;
  Real local_1d8;
  int local_1d0;
  IntVect *local_1c8;
  Real local_1bc;
  int local_1b4;
  int local_1b0 [2];
  int local_1a8;
  int local_1a0;
  int iStack_19c;
  int local_198;
  IntVect local_194;
  AmrMesh *local_188;
  BoxArray *local_180;
  undefined4 local_174;
  AmrMesh *local_170;
  IntVect *local_168;
  IntVect *local_160;
  undefined4 local_154;
  IntVect *local_150;
  undefined4 local_144;
  IntVect *local_140;
  undefined4 local_134;
  IntVect *local_130;
  IntVect *local_128;
  IntVect *local_120;
  undefined4 local_114;
  IntVect *local_110;
  undefined4 local_104;
  IntVect *local_100;
  undefined4 local_f4;
  IntVect *local_f0;
  int *local_e8;
  IntVect *local_e0;
  undefined4 local_d4;
  int *local_d0;
  undefined4 local_c4;
  int *local_c0;
  undefined4 local_b4;
  int *local_b0;
  int local_a8 [2];
  int local_a0;
  IntVect *local_98;
  IntVect local_8c;
  AmrMesh *local_80;
  IntVect *local_78;
  undefined4 local_6c;
  AmrMesh *local_68;
  undefined4 local_5c;
  AmrMesh *local_58;
  undefined4 local_4c;
  AmrMesh *local_48;
  AmrMesh *local_40;
  BoxArray *local_38;
  undefined4 local_2c;
  AmrMesh *local_28;
  undefined4 local_1c;
  AmrMesh *local_18;
  undefined4 local_c;
  AmrMesh *local_8;
  
  if ((((in_RDI->smallend).vect[2] != 0) &&
      (bVar5 = AmrMesh::useFixedCoarseGrids(*(AmrMesh **)in_RDI[0xc].smallend.vect), bVar5)) &&
     (iVar6 = AmrMesh::useFixedUpToLevel(*(AmrMesh **)in_RDI[0xc].smallend.vect),
     iVar6 <= (in_RDI->smallend).vect[2])) {
    iVar6 = AmrMesh::useFixedUpToLevel(*(AmrMesh **)in_RDI[0xc].smallend.vect);
    if (iVar6 == (in_RDI->smallend).vect[2]) {
      local_22c._28_8_ = Amr::getInitialBA(*(Amr **)in_RDI[0xc].smallend.vect);
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffffbe0,(size_type)in_stack_fffffffffffffbd8);
      in_stack_fffffffffffffbf0 = (AmrMesh *)local_22c;
      BoxArray::minimalBox(in_stack_fffffffffffffd58);
      local_1c8 = AmrMesh::blockingFactor
                            ((AmrMesh *)in_stack_fffffffffffffbe0,
                             (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
      IntVect::IntVect((IntVect *)&local_1bc,-local_1c8->vect[0],-local_1c8->vect[1],
                       -local_1c8->vect[2]);
      local_1d0 = local_1b4;
      local_1d8 = local_1bc;
      local_230 = local_1b4;
      local_238 = local_1bc;
      Box::grow((Box *)in_stack_fffffffffffffbf0,(IntVect *)&local_238);
      *(ulong *)(in_RDI[0x12].smallend.vect + 1) = CONCAT44(local_22c._16_4_,local_22c._12_4_);
      *(undefined8 *)in_RDI[0x12].bigend.vect = local_22c._20_8_;
      *(undefined8 *)(in_RDI[0x11].bigend.vect + 2) = local_22c._0_8_;
      *(ulong *)in_RDI[0x12].smallend.vect = CONCAT44(local_22c._12_4_,local_22c._8_4_);
      pGVar7 = AmrMesh::Geom((AmrMesh *)in_stack_fffffffffffffbe0,
                             (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
      Geometry::Domain(pGVar7);
      in_stack_fffffffffffffc00 = (Box *)&stack0xfffffffffffffd50;
      boxComplement(in_RDI,in_stack_fffffffffffffc00);
      BoxArray::operator=((BoxArray *)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8);
      pGVar7 = AmrMesh::Geom((AmrMesh *)in_stack_fffffffffffffbe0,
                             (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
      Geometry::Domain(pGVar7);
      BoxArray::BoxArray(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffbe0);
      BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffbe0);
    }
    lev = (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
    iVar6 = AmrMesh::useFixedUpToLevel(*(AmrMesh **)in_RDI[0xc].smallend.vect);
    if (iVar6 < (in_RDI->smallend).vect[2]) {
      this_00 = Amr::getLevel(in_stack_fffffffffffffbe0,lev);
      pBVar8 = getAreaToTag(this_00);
      local_348.m_bat._0_8_ = *(undefined8 *)(pBVar8->smallend).vect;
      uVar2 = *(undefined8 *)((pBVar8->smallend).vect + 2);
      uVar3 = *(undefined8 *)((pBVar8->bigend).vect + 2);
      local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] =
           (int)((ulong)*(undefined8 *)(pBVar8->bigend).vect >> 0x20);
      local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2] = (int)uVar3;
      local_348.m_bat.m_op.m_bndryReg.m_loshft.vect[0] = (int)((ulong)uVar3 >> 0x20);
      local_348.m_bat.m_op.m_bndryReg.m_typ.itype = SUB84(uVar2,0);
      local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0] = (int)((ulong)uVar2 >> 0x20);
      local_368 = (int  [3])AmrMesh::refRatio(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbec);
      local_354 = (_func_int **)local_368._0_8_;
      pp_Var4 = local_354;
      local_34c = local_368[2];
      rhs = &local_348;
      this_01 = (AmrMesh *)&local_354;
      local_174 = 1;
      local_354._0_4_ = local_368[0];
      bVar5 = true;
      if ((int)local_354 == 1) {
        local_354._4_4_ = local_368[1];
        bVar5 = true;
        if (local_354._4_4_ == 1) {
          bVar5 = local_368[2] != 1;
        }
      }
      local_354 = pp_Var4;
      local_188 = this_01;
      local_180 = rhs;
      local_170 = this_01;
      if (bVar5) {
        IntVect::IntVect(&local_194,1);
        local_98 = &(rhs->m_bat).m_op.m_bndryReg.m_loshft;
        uVar1 = local_98->vect[0];
        IntVect::IntVect(&local_8c,uVar1 & 1,uVar1 >> 1 & 1,uVar1 >> 2 & 1);
        local_a0 = local_8c.vect[2];
        local_a8[0] = local_8c.vect[0];
        local_a8[1] = local_8c.vect[1];
        local_1a8 = local_8c.vect[2];
        local_1b0[0] = local_8c.vect[0];
        local_1b0[1] = local_8c.vect[1];
        local_1a0 = local_8c.vect[0];
        iStack_19c = local_8c.vect[1];
        uVar2 = _local_1a0;
        local_198 = local_8c.vect[2];
        local_e0 = &local_194;
        local_e8 = &local_1a0;
        local_b4 = 0;
        local_1a0 = local_8c.vect[0];
        local_194.vect[0] = local_194.vect[0] - local_1a0;
        local_c4 = 1;
        iStack_19c = local_8c.vect[1];
        local_194.vect[1] = local_194.vect[1] - iStack_19c;
        local_d4 = 2;
        local_194.vect[2] = local_194.vect[2] - local_8c.vect[2];
        local_40 = local_188;
        local_8 = local_188;
        local_c = 0;
        pBVar9 = rhs;
        _local_1a0 = uVar2;
        local_d0 = local_e8;
        local_c0 = local_e8;
        local_b0 = local_e8;
        local_38 = rhs;
        (rhs->m_bat).m_bat_type = *(int *)&local_188->_vptr_AmrMesh * (rhs->m_bat).m_bat_type;
        local_18 = local_40;
        local_1c = 1;
        *(int *)&(rhs->m_bat).m_op =
             *(int *)((long)&local_40->_vptr_AmrMesh + 4) * *(int *)&(rhs->m_bat).m_op;
        local_28 = local_40;
        local_2c = 2;
        *(int *)((long)&(rhs->m_bat).m_op + 4) =
             (local_40->super_AmrInfo).verbose * *(int *)((long)&(rhs->m_bat).m_op + 4);
        local_160 = &(rhs->m_bat).m_op.m_bndryReg.m_crse_ratio;
        local_168 = &local_194;
        local_134 = 0;
        local_130 = local_168;
        local_160->vect[0] = local_194.vect[0] + local_160->vect[0];
        local_140 = local_168;
        local_144 = 1;
        (rhs->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[1] =
             local_168->vect[1] + (rhs->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[1];
        local_150 = local_168;
        local_154 = 2;
        (rhs->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[2] =
             local_168->vect[2] + (rhs->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[2];
        local_78 = &(rhs->m_bat).m_op.m_bndryReg.m_crse_ratio;
        local_80 = local_188;
        local_48 = local_188;
        local_4c = 0;
        local_78->vect[0] = *(int *)&local_188->_vptr_AmrMesh * local_78->vect[0];
        local_58 = local_80;
        local_5c = 1;
        (rhs->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[1] =
             *(int *)((long)&local_80->_vptr_AmrMesh + 4) *
             (rhs->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[1];
        local_68 = local_80;
        local_6c = 2;
        (rhs->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[2] =
             (local_80->super_AmrInfo).verbose * (rhs->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[2];
        local_120 = &(rhs->m_bat).m_op.m_bndryReg.m_crse_ratio;
        local_128 = &local_194;
        local_f4 = 0;
        local_f0 = local_128;
        local_120->vect[0] = local_120->vect[0] - local_194.vect[0];
        local_100 = local_128;
        local_104 = 1;
        (rhs->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[1] =
             (rhs->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[1] - local_128->vect[1];
        local_110 = local_128;
        local_114 = 2;
        (rhs->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[2] =
             (rhs->m_bat).m_op.m_bndryReg.m_crse_ratio.vect[2] - local_128->vect[2];
        rhs = pBVar9;
      }
      local_22c._60_8_ = AmrMesh::blockingFactor(this_01,(int)((ulong)rhs >> 0x20));
      IntVect::IntVect((IntVect *)(local_22c + 0x48),-((IntVect *)local_22c._60_8_)->vect[0],
                       -((IntVect *)local_22c._60_8_)->vect[1],
                       -((IntVect *)local_22c._60_8_)->vect[2]);
      local_22c._52_4_ = local_1dc;
      local_22c._44_8_ = local_22c._72_8_;
      local_374 = (pointer)local_22c._72_8_;
      local_36c = local_1dc;
      Box::grow((Box *)&local_348,(IntVect *)&local_374);
      *(undefined8 *)(in_RDI[0x11].bigend.vect + 2) = local_348.m_bat._0_8_;
      *(ulong *)in_RDI[0x12].smallend.vect =
           CONCAT44(local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[0],
                    local_348.m_bat.m_op.m_bndryReg.m_typ.itype);
      *(ulong *)(in_RDI[0x12].smallend.vect + 2) =
           CONCAT44(local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[2],
                    local_348.m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1]);
      in_RDI[0x12].bigend.vect[1] = local_348.m_bat.m_op.m_bndryReg.m_loshft.vect[0];
      pGVar7 = AmrMesh::Geom(this_01,(int)((ulong)rhs >> 0x20));
      Geometry::Domain(pGVar7);
      boxComplement(in_RDI,in_stack_fffffffffffffc00);
      BoxArray::operator=((BoxArray *)this_01,rhs);
      BoxArray::~BoxArray((BoxArray *)this_01);
    }
  }
  return;
}

Assistant:

void AmrLevel::constructAreaNotToTag ()
{
    if (level == 0 || !parent->useFixedCoarseGrids() || parent->useFixedUpToLevel()>level)
        return;

    // We are restricting the tagging on the finest fixed level
    if (parent->useFixedUpToLevel()==level)
    {
        // We use the next coarser level shrunk by one blockingfactor
        //    as the region in which we allow tagging.
        // Why level-1? Because we always use the full domain at level 0
        //    and therefore level 0 in initialba is level 1 in the AMR hierarchy, etc.
        const Vector<BoxArray>& initialba = parent->getInitialBA();
        Box tagarea(initialba[level-1].minimalBox());
        tagarea.grow(-parent->blockingFactor(level));
        m_AreaToTag = tagarea;

        // We disallow tagging in the remaining part of the domain.
        BoxArray tagba = amrex::boxComplement(parent->Geom(level).Domain(),m_AreaToTag);
        m_AreaNotToTag = tagba;

        BoxArray bxa(parent->Geom(level).Domain());
        BL_ASSERT(bxa.contains(m_AreaNotToTag));
    }

    if (parent->useFixedUpToLevel()<level)
    {
        Box tagarea = parent->getLevel(level-1).getAreaToTag();
        tagarea.refine(parent->refRatio(level-1));
        tagarea.grow(-parent->blockingFactor(level));
        m_AreaToTag = tagarea;
        BoxArray tagba = amrex::boxComplement(parent->Geom(level).Domain(),m_AreaToTag);
        m_AreaNotToTag = tagba;
    }
}